

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# damageind.cpp
# Opt level: O3

void __thiscall CDamageInd::OnRender(CDamageInd *this)

{
  CItem *pCVar1;
  float fVar2;
  vec2 vVar3;
  int iVar4;
  IGraphics *pIVar5;
  int iVar6;
  CDamageInd *this_00;
  float fVar7;
  float fVar8;
  uint uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  pIVar5 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  (*(pIVar5->super_IInterface)._vptr_IInterface[0x13])
            (pIVar5,(ulong)(uint)g_pData->m_aImages[1].m_Id.m_Id);
  this_00 = (CDamageInd *)((this->super_CComponent).m_pClient)->m_pGraphics;
  (*(this_00->super_CComponent)._vptr_CComponent[0x17])();
  fVar2 = ((this->super_CComponent).m_pClient)->m_pClient->m_LocalTime;
  if (OnRender()::s_LastLocalTime == '\0') {
    OnRender(this_00);
  }
  if (0 < this->m_NumItems) {
    iVar6 = 0;
    do {
      fVar7 = fVar2 - OnRender::s_LastLocalTime;
      fVar8 = CGameClient::GetAnimationPlaybackSpeed((this->super_CComponent).m_pClient);
      pCVar1 = this->m_aItems + iVar6;
      fVar7 = pCVar1->m_LifeTime - fVar8 * fVar7;
      pCVar1->m_LifeTime = fVar7;
      if (0.0 <= fVar7) {
        fVar10 = (pCVar1->m_Dir).field_0.x * 75.0 + (pCVar1->m_Pos).field_0.x;
        fVar11 = (pCVar1->m_Dir).field_1.y * 75.0 + (pCVar1->m_Pos).field_1.y;
        vVar3 = pCVar1->m_Pos;
        fVar12 = (fVar7 + -0.6) / 0.15;
        fVar8 = 1.0;
        if (fVar12 <= 1.0) {
          fVar8 = fVar12;
        }
        fVar8 = (float)(~-(uint)(fVar12 < 0.0) & (uint)fVar8);
        fVar7 = fVar7 * 10.0;
        fVar12 = 1.0;
        if (fVar7 <= 1.0) {
          fVar12 = fVar7;
        }
        uVar9 = ~-(uint)(fVar7 < 0.0) & (uint)fVar12;
        (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface
          [0x21])(uVar9,uVar9,uVar9,uVar9);
        (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface
          [0x19])(pCVar1->m_LifeTime + pCVar1->m_LifeTime + pCVar1->m_StartAngle);
        CRenderTools::SelectSprite(&((this->super_CComponent).m_pClient)->m_RenderTools,0xe,0,0,0);
        CRenderTools::DrawSprite
                  (&((this->super_CComponent).m_pClient)->m_RenderTools,
                   (vVar3.field_0.x - fVar10) * fVar8 + fVar10,
                   (vVar3.field_1.y - fVar11) * fVar8 + fVar11,48.0);
        iVar6 = iVar6 + 1;
      }
      else {
        iVar4 = this->m_NumItems;
        this->m_NumItems = iVar4 + -1;
        if (iVar4 + -1 != iVar6) {
          fVar7 = this->m_aItems[(long)iVar4 + -1].m_StartAngle;
          pCVar1->m_LifeTime = this->m_aItems[(long)iVar4 + -1].m_LifeTime;
          pCVar1->m_StartAngle = fVar7;
          vVar3 = this->m_aItems[(long)iVar4 + -1].m_Dir;
          pCVar1->m_Pos = this->m_aItems[(long)iVar4 + -1].m_Pos;
          pCVar1->m_Dir = vVar3;
        }
      }
    } while (iVar6 < this->m_NumItems);
  }
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
  OnRender::s_LastLocalTime = fVar2;
  return;
}

Assistant:

void CDamageInd::OnRender()
{
	Graphics()->TextureSet(g_pData->m_aImages[IMAGE_GAME].m_Id);
	Graphics()->QuadsBegin();
	const float Now = Client()->LocalTime();
	static float s_LastLocalTime = Now;
	for(int i = 0; i < m_NumItems;)
	{
		m_aItems[i].m_LifeTime -= (Now - s_LastLocalTime) * m_pClient->GetAnimationPlaybackSpeed();
		if(m_aItems[i].m_LifeTime < 0.0f)
			DestroyItem(&m_aItems[i]);
		else
		{
			vec2 Pos = mix(m_aItems[i].m_Pos+m_aItems[i].m_Dir*75.0f, m_aItems[i].m_Pos, clamp((m_aItems[i].m_LifeTime-0.60f)/0.15f, 0.0f, 1.0f));
			const float Alpha = clamp(m_aItems[i].m_LifeTime * 10.0f, 0.0f, 1.0f); // 0.1 -> 0.0 == 1.0 -> 0.0
			Graphics()->SetColor(1.0f*Alpha, 1.0f*Alpha, 1.0f*Alpha, Alpha);
			Graphics()->QuadsSetRotation(m_aItems[i].m_StartAngle + m_aItems[i].m_LifeTime * 2.0f);
			RenderTools()->SelectSprite(SPRITE_STAR1);
			RenderTools()->DrawSprite(Pos.x, Pos.y, 48.0f);
			i++;
		}
	}
	Graphics()->QuadsEnd();
	s_LastLocalTime = Now;
}